

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relooper.cpp
# Opt level: O1

Expression * __thiscall CFG::LoopShape::Render(LoopShape *this,RelooperBuilder *Builder,bool InLoop)

{
  Shape *pSVar1;
  int iVar2;
  undefined4 extraout_var;
  Loop *this_00;
  Expression *left;
  undefined4 extraout_var_00;
  Block *pBVar3;
  undefined7 in_register_00000011;
  ulong uVar4;
  string_view sVar5;
  optional<wasm::Type> type;
  optional<wasm::Type> type_;
  
  sVar5 = (string_view)RelooperBuilder::getShapeContinueName(Builder,(this->super_Shape).Id);
  iVar2 = (*this->Inner->_vptr_Shape[2])(this->Inner,Builder,1);
  uVar4 = 0x28;
  this_00 = (Loop *)MixedArena::allocSpace(&((Builder->super_Builder).wasm)->allocator,0x28,8);
  (this_00->super_SpecificExpression<(wasm::Expression::Id)3>).super_Expression._id = LoopId;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)3>).super_Expression.type.id = 0;
  (this_00->name).super_IString.str._M_len = 0;
  (this_00->name).super_IString.str = sVar5;
  this_00->body = (Expression *)CONCAT44(extraout_var,iVar2);
  type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar4;
  ::wasm::Loop::finalize(this_00,type_);
  uVar4 = CONCAT71(in_register_00000011,InLoop) & 0xffffffff;
  left = HandleFollowupMultiples((Expression *)this_00,&this->super_Shape,Builder,InLoop);
  pSVar1 = (this->super_Shape).Next;
  if (pSVar1 != (Shape *)0x0) {
    iVar2 = (*pSVar1->_vptr_Shape[2])
                      (pSVar1,Builder,(ulong)((uint)CONCAT71(in_register_00000011,InLoop) & 0xff));
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar4;
    pBVar3 = ::wasm::Builder::makeSequence
                       (&Builder->super_Builder,left,(Expression *)CONCAT44(extraout_var_00,iVar2),
                        type);
    return (Expression *)pBVar3;
  }
  return left;
}

Assistant:

wasm::Expression* LoopShape::Render(RelooperBuilder& Builder, bool InLoop) {
  wasm::Expression* Ret = Builder.makeLoop(Builder.getShapeContinueName(Id),
                                           Inner->Render(Builder, true));
  Ret = HandleFollowupMultiples(Ret, this, Builder, InLoop);
  if (Next) {
    Ret = Builder.makeSequence(Ret, Next->Render(Builder, InLoop));
  }
  return Ret;
}